

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiWindow *potential_parent;
  bool mouse_dragging_extern_payload;
  bool mouse_avail_to_imgui;
  int i;
  bool mouse_any_down;
  int mouse_earliest_button_down;
  ImGuiWindow *modal_window;
  ImGuiContext *g;
  bool local_24;
  bool local_23;
  byte local_22;
  byte local_20;
  byte local_1f;
  int local_1c;
  int local_14;
  
  pIVar1 = GImGui;
  FindHoveredWindow();
  potential_parent = GetTopMostPopupModal();
  if (((potential_parent != (ImGuiWindow *)0x0) && (pIVar1->HoveredRootWindow != (ImGuiWindow *)0x0)
      ) && (bVar2 = IsWindowChildOf(pIVar1->HoveredRootWindow,potential_parent), !bVar2)) {
    pIVar1->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar1->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar1->HoveredWindow = (ImGuiWindow *)0x0;
  }
  if (((pIVar1->IO).ConfigFlags & 0x10U) != 0) {
    pIVar1->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar1->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar1->HoveredWindow = (ImGuiWindow *)0x0;
  }
  local_14 = -1;
  bVar2 = false;
  for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
    if (((pIVar1->IO).MouseClicked[local_1c] & 1U) != 0) {
      local_1f = 1;
      if (pIVar1->HoveredWindow == (ImGuiWindow *)0x0) {
        bVar3 = ImVector<ImGuiPopupData>::empty(&pIVar1->OpenPopupStack);
        local_1f = bVar3 ^ 0xff;
      }
      (pIVar1->IO).MouseDownOwned[local_1c] = (bool)(local_1f & 1);
    }
    bVar2 = bVar2 || ((pIVar1->IO).MouseDown[local_1c] & 1U) != 0;
    if ((((pIVar1->IO).MouseDown[local_1c] & 1U) != 0) &&
       ((local_14 == -1 ||
        ((pIVar1->IO).MouseClickedTime[local_1c] < (pIVar1->IO).MouseClickedTime[local_14])))) {
      local_14 = local_1c;
    }
  }
  local_20 = 1;
  if (local_14 != -1) {
    local_20 = (pIVar1->IO).MouseDownOwned[local_14];
  }
  bVar3 = false;
  if ((pIVar1->DragDropActive & 1U) != 0) {
    bVar3 = (pIVar1->DragDropSourceFlags & 0x10U) != 0;
  }
  if (((local_20 & 1) == 0) && (!bVar3)) {
    pIVar1->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
    pIVar1->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar1->HoveredWindow = (ImGuiWindow *)0x0;
  }
  if (pIVar1->WantCaptureMouseNextFrame == -1) {
    if (((local_20 & 1) == 0) ||
       ((local_22 = 1, pIVar1->HoveredWindow == (ImGuiWindow *)0x0 && (local_22 = 1, !bVar2)))) {
      bVar2 = ImVector<ImGuiPopupData>::empty(&pIVar1->OpenPopupStack);
      local_22 = bVar2 ^ 0xff;
    }
    (pIVar1->IO).WantCaptureMouse = (bool)(local_22 & 1);
  }
  else {
    (pIVar1->IO).WantCaptureMouse = pIVar1->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar1->WantCaptureKeyboardNextFrame == -1) {
    local_23 = pIVar1->ActiveId != 0 || potential_parent != (ImGuiWindow *)0x0;
    (pIVar1->IO).WantCaptureKeyboard = local_23;
  }
  else {
    (pIVar1->IO).WantCaptureKeyboard = pIVar1->WantCaptureKeyboardNextFrame != 0;
  }
  if (((((pIVar1->IO).NavActive & 1U) != 0) && (((pIVar1->IO).ConfigFlags & 1U) != 0)) &&
     (((pIVar1->IO).ConfigFlags & 8U) == 0)) {
    (pIVar1->IO).WantCaptureKeyboard = true;
  }
  if (pIVar1->WantTextInputNextFrame == -1) {
    local_24 = false;
  }
  else {
    local_24 = pIVar1->WantTextInputNextFrame != 0;
  }
  (pIVar1->IO).WantTextInput = local_24;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    FindHoveredWindow();
    IM_ASSERT(g.HoveredWindow == NULL || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport);

    // Modal windows prevents cursor from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window)
        if (g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
            g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (!g.OpenPopupStack.empty());

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}